

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  bool bVar1;
  ulong uVar2;
  string *in_RSI;
  Parser *in_RDI;
  char *in_stack_00000010;
  Parser *in_stack_00000018;
  Tokenizer *in_stack_00000058;
  int brace_depth;
  char *in_stack_ffffffffffffff88;
  Parser *in_stack_ffffffffffffff90;
  allocator *paVar3;
  string *in_stack_ffffffffffffff98;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  string *local_18;
  
  local_18 = in_RSI;
  bVar1 = Consume(in_stack_00000018,in_stack_00000010);
  if (bVar1) {
    local_1c = 1;
    while (bVar1 = AtEnd((Parser *)0x6102d8), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = LookingAt(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar1) {
        local_1c = local_1c + 1;
      }
      else {
        bVar1 = LookingAt(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        if ((bVar1) && (local_1c = local_1c + -1, local_1c == 0)) {
          io::Tokenizer::Next(in_stack_00000058);
          return true;
        }
      }
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::push_back((char)local_18);
      }
      in_stack_ffffffffffffff98 = local_18;
      io::Tokenizer::current(in_RDI->input_);
      std::__cxx11::string::append((string *)in_stack_ffffffffffffff98);
      io::Tokenizer::Next(in_stack_00000058);
    }
    paVar3 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Unexpected end of stream while parsing aggregate value.",paVar3);
    AddError(in_RDI,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO(sanjay): Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  AddError("Unexpected end of stream while parsing aggregate value.");
  return false;
}